

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

void __thiscall
cmTargetTraceDependencies::CheckCustomCommands
          (cmTargetTraceDependencies *this,
          vector<cmCustomCommand,_std::allocator<cmCustomCommand>_> *commands)

{
  cmCustomCommand *pcVar1;
  cmCustomCommand *command;
  cmCustomCommand *cc;
  
  pcVar1 = (commands->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>)._M_impl
           .super__Vector_impl_data._M_finish;
  for (cc = (commands->super__Vector_base<cmCustomCommand,_std::allocator<cmCustomCommand>_>).
            _M_impl.super__Vector_impl_data._M_start; cc != pcVar1; cc = cc + 1) {
    CheckCustomCommand(this,cc);
  }
  return;
}

Assistant:

cmValue cmGeneratorTarget::GetLanguageStandard(std::string const& lang,
                                               std::string const& config) const
{
  BTs<std::string> const* languageStandard =
    this->GetLanguageStandardProperty(lang, config);

  if (languageStandard) {
    return cmValue(languageStandard->Value);
  }

  return nullptr;
}